

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O1

bool __thiscall deqp::gles31::Functional::ProgramInterfaceDefinition::Shader::isValid(Shader *this)

{
  int iVar1;
  Type TVar2;
  long lVar3;
  pointer pIVar4;
  bool bVar5;
  int iVar6;
  pointer piVar7;
  long lVar8;
  pointer *ppiVar9;
  Storage *pSVar10;
  int iVar11;
  pointer piVar12;
  int iVar13;
  pointer pVVar14;
  VarType *pVVar15;
  ulong uVar16;
  pointer pIVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  Interpolation *pIVar21;
  bool bVar22;
  bool bVar23;
  Layout layoutWithLocationAndBinding;
  Layout local_44;
  
  pVVar14 = (this->m_defaultBlock).variables.
            super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>.
            _M_impl.super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14) >> 5) *
          -0x55555555;
  bVar22 = 0 < iVar6;
  if (0 < iVar6) {
    iVar6 = 0;
    lVar18 = 0x20;
    do {
      if ((((*(int *)((long)pVVar14 + lVar18 + -0x1c) == -1) &&
           (bVar5 = anon_unknown_0::containsMatchingSubtype
                              ((VarType *)((long)&(pVVar14->layout).location + lVar18),
                               glu::isDataTypeAtomicCounter), bVar5)) ||
          ((pVVar14 = (this->m_defaultBlock).variables.
                      super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)&(pVVar14->layout).location + lVar18) == 2 &&
           (bVar5 = anon_unknown_0::containsMatchingSubtype
                              ((VarType *)((long)&(pVVar14->layout).location + lVar18),
                               glu::isDataTypeAtomicCounter), bVar5)))) ||
         (pVVar14 = (this->m_defaultBlock).variables.
                    super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                    ._M_impl.super__Vector_impl_data._M_start,
         *(int *)((long)pVVar14 + lVar18 + -0x10) != 2)) {
LAB_00672f70:
        if (bVar22) {
          return false;
        }
        break;
      }
      bVar5 = anon_unknown_0::containsMatchingSubtype
                        ((VarType *)((long)&(pVVar14->layout).location + lVar18),
                         glu::isDataTypeSampler);
      if (bVar5) {
        pVVar14 = (this->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        glu::Layout::Layout(&local_44,*(int *)((long)pVVar14 + lVar18 + -0x20),
                            *(int *)((long)pVVar14 + lVar18 + -0x1c),-1,FORMATLAYOUT_LAST,
                            MATRIXORDER_LAST);
        bVar5 = glu::Layout::operator!=
                          ((Layout *)
                           ((long)(this->m_defaultBlock).variables.
                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar18 + -0x20),
                           &local_44);
        if (bVar5) goto LAB_00672f70;
      }
      iVar6 = iVar6 + 1;
      pVVar14 = (this->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar11 = (int)((ulong)((long)(this->m_defaultBlock).variables.
                                   super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14) >> 5)
      ;
      lVar18 = lVar18 + 0x60;
      bVar23 = SBORROW4(iVar6,iVar11 * -0x55555555);
      bVar5 = iVar6 + iVar11 * 0x55555555 < 0;
      bVar22 = bVar23 != bVar5;
    } while (bVar23 != bVar5);
  }
  pIVar17 = (this->m_defaultBlock).interfaceBlocks.
            super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar6 = (int)((ulong)((long)(this->m_defaultBlock).interfaceBlocks.
                              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17) >> 4) *
          0x38e38e39;
  bVar22 = 0 < iVar6;
  if (0 < iVar6) {
    piVar7 = (pIVar17->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar12 = *(pointer *)
               ((long)&(pIVar17->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl +
               8);
    if ((ulong)((long)piVar12 - (long)piVar7) < 5) {
      uVar20 = 0;
      do {
        if ((piVar7 != piVar12) && ((pIVar17->instanceName)._M_string_length == 0)) break;
        lVar18 = *(long *)&(pIVar17->variables).
                           super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                           ._M_impl.super__Vector_impl_data;
        iVar6 = (int)((ulong)((long)*(pointer *)
                                     ((long)&(pIVar17->variables).
                                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                             ._M_impl + 8) - lVar18) >> 5) * -0x55555555;
        bVar5 = 0 < iVar6;
        if ((0 < iVar6) &&
           (bVar23 = anon_unknown_0::containsMatchingSubtype
                               ((VarType *)(lVar18 + 0x20),anon_unknown_0::isOpaqueType), !bVar23))
        {
          lVar19 = 0x80;
          lVar18 = 0;
          do {
            lVar18 = lVar18 + 1;
            lVar3 = *(long *)&(pIVar17->variables).
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl.super__Vector_impl_data;
            lVar8 = (long)((int)((ulong)((long)*(pointer *)
                                                ((long)&(pIVar17->variables).
                                                                                                                
                                                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                                  ._M_impl + 8) - lVar3) >> 5) * -0x55555555);
            bVar5 = lVar18 < lVar8;
            if (lVar8 <= lVar18) break;
            pVVar15 = (VarType *)(lVar3 + lVar19);
            lVar19 = lVar19 + 0x60;
            bVar23 = anon_unknown_0::containsMatchingSubtype(pVVar15,anon_unknown_0::isOpaqueType);
          } while (!bVar23);
        }
        if (bVar5) break;
        uVar20 = uVar20 + 1;
        pIVar4 = (this->m_defaultBlock).interfaceBlocks.
                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar6 = (int)((ulong)((long)(this->m_defaultBlock).interfaceBlocks.
                                    super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar4) >> 4)
        ;
        bVar23 = SBORROW4(uVar20,iVar6 * 0x38e38e39);
        bVar5 = (int)(uVar20 + iVar6 * -0x38e38e39) < 0;
        bVar22 = bVar23 != bVar5;
        if (bVar23 == bVar5) goto LAB_006730a3;
        pIVar17 = pIVar4 + uVar20;
        piVar7 = pIVar4[uVar20].dimensions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar12 = *(pointer *)
                   ((long)&pIVar4[uVar20].dimensions.super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl + 8);
      } while ((ulong)((long)piVar12 - (long)piVar7) < 5);
    }
    if (bVar22) {
      return false;
    }
  }
LAB_006730a3:
  switch(this->m_shaderType) {
  case SHADERTYPE_VERTEX:
    pVVar14 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 5) *
             -0x55555555;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pIVar21 = &pVVar14->interpolation;
      uVar16 = 1;
      do {
        if ((pIVar21[1] == STORAGE_IN) &&
           ((((VarType *)(pIVar21 + 3))->m_type != TYPE_BASIC ||
            ((((Data *)(pIVar21 + 5))->basic).type - TYPE_BOOL < 4)))) {
LAB_0067361d:
          if (bVar22) {
            return false;
          }
          break;
        }
        if (pIVar21[1] == STORAGE_OUT) {
          bVar5 = isIllegalVertexOutput((VarType *)(pIVar21 + 3),false,false);
          if ((bVar5) ||
             ((*pIVar21 != INTERPOLATION_FLAT &&
              (bVar5 = isTypeIntegerOrContainsIntegers((VarType *)(pIVar21 + 3)), bVar5))))
          goto LAB_0067361d;
        }
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pIVar21 = pIVar21 + 0x18;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    pIVar17 = (this->m_defaultBlock).interfaceBlocks.
              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).interfaceBlocks.
                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17 >> 4) *
             0x38e38e39;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pSVar10 = &pIVar17->storage;
      uVar16 = 1;
      do {
        if ((*pSVar10 < STORAGE_LAST) && ((0x61U >> (*pSVar10 & 0x1f) & 1) != 0)) {
LAB_0067370d:
          if (!bVar22) {
            return true;
          }
          return false;
        }
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pSVar10 = pSVar10 + 0x24;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    break;
  case SHADERTYPE_FRAGMENT:
    pVVar14 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 5) *
             -0x55555555;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pVVar15 = &pVVar14->varType;
      uVar16 = 1;
      do {
        iVar6 = pVVar15[-1].m_data.array.size;
        if (((iVar6 == 0) &&
            ((bVar5 = isIllegalVertexOutput(pVVar15,false,false), bVar5 ||
             ((pVVar15[-1].m_data.basic.precision != PRECISION_MEDIUMP &&
              (bVar5 = isTypeIntegerOrContainsIntegers(pVVar15), bVar5)))))) ||
           ((iVar6 == 1 && (bVar5 = isIllegalFragmentOutput(pVVar15,false), bVar5)))) {
          if (bVar22) {
            return false;
          }
          break;
        }
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pVVar15 = pVVar15 + 4;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    pIVar17 = (this->m_defaultBlock).interfaceBlocks.
              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).interfaceBlocks.
                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17 >> 4) *
             0x38e38e39;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pSVar10 = &pIVar17->storage;
      uVar16 = 1;
      do {
        if ((*pSVar10 < STORAGE_LAST) && ((0x62U >> (*pSVar10 & 0x1f) & 1) != 0)) goto LAB_0067370d;
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pSVar10 = pSVar10 + 0x24;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    break;
  case SHADERTYPE_GEOMETRY:
    pVVar14 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 5) *
             -0x55555555;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pVVar15 = &pVVar14->varType;
      uVar16 = 1;
      do {
        if (*(MatrixOrder *)((long)(pVVar15 + -1) + 0x10) == 0) {
          if (pVVar15->m_type != TYPE_ARRAY) goto LAB_0067348c;
        }
        else if (*(MatrixOrder *)((long)(pVVar15 + -1) + 0x10) - 5 < 2) {
LAB_0067348c:
          if (bVar22) {
            return false;
          }
          break;
        }
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pVVar15 = pVVar15 + 4;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    pIVar17 = (this->m_defaultBlock).interfaceBlocks.
              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).interfaceBlocks.
                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17 >> 4) *
             0x38e38e39;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      ppiVar9 = (pointer *)
                ((long)&(pIVar17->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl
                + 8);
      uVar16 = 1;
      do {
        if (*(int *)((long)ppiVar9 + -0x6c) == 0) {
          if (((_Vector_impl_data *)(ppiVar9 + -1))->_M_start == *ppiVar9) goto LAB_0067370d;
        }
        else if (*(int *)((long)ppiVar9 + -0x6c) - 5U < 2) goto LAB_0067370d;
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        ppiVar9 = ppiVar9 + 0x12;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    break;
  case SHADERTYPE_TESSELLATION_CONTROL:
    pVVar14 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = (int)((ulong)((long)(this->m_defaultBlock).variables.
                                 super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14) >> 5);
    iVar6 = iVar11 * -0x55555555;
    bVar22 = 0 < iVar6;
    if (0 < iVar6) {
      pVVar15 = &pVVar14->varType;
      iVar13 = 1;
      do {
        iVar1 = *(MatrixOrder *)((long)(pVVar15 + -1) + 0x10);
        if (iVar1 == 0) {
          TVar2 = pVVar15->m_type;
joined_r0x006732b7:
          if (TVar2 != TYPE_ARRAY) {
LAB_00673518:
            if (bVar22) {
              return false;
            }
            break;
          }
        }
        else {
          if (iVar1 == 1) {
            TVar2 = pVVar15->m_type;
            goto joined_r0x006732b7;
          }
          if (iVar1 == 5) goto LAB_00673518;
        }
        bVar22 = iVar13 < iVar6;
        pVVar15 = pVVar15 + 4;
        iVar1 = iVar11 * 0x55555555 + iVar13;
        iVar13 = iVar13 + 1;
      } while (iVar1 != 0);
    }
    pIVar17 = (this->m_defaultBlock).interfaceBlocks.
              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar11 = (int)((ulong)((long)(this->m_defaultBlock).interfaceBlocks.
                                 super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17) >> 4);
    iVar6 = iVar11 * 0x38e38e39;
    bVar22 = 0 < iVar6;
    if (0 < iVar6) {
      ppiVar9 = (pointer *)
                ((long)&(pIVar17->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl
                + 8);
      iVar13 = 1;
      do {
        iVar1 = *(int *)((long)ppiVar9 + -0x6c);
        if (iVar1 == 0) {
          if (((_Vector_impl_data *)(ppiVar9 + -1))->_M_start == *ppiVar9) goto LAB_0067370d;
        }
        else if (iVar1 == 1) {
          if (((_Vector_impl_data *)(ppiVar9 + -1))->_M_start == *ppiVar9) goto LAB_0067370d;
        }
        else if (iVar1 == 5) goto LAB_0067370d;
        bVar22 = iVar13 < iVar6;
        ppiVar9 = ppiVar9 + 0x12;
        iVar1 = iVar11 * -0x38e38e39 + iVar13;
        iVar13 = iVar13 + 1;
      } while (iVar1 != 0);
    }
    break;
  case SHADERTYPE_TESSELLATION_EVALUATION:
    pVVar14 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar6 = (int)((ulong)((long)(this->m_defaultBlock).variables.
                                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14) >> 5);
    iVar11 = iVar6 * -0x55555555;
    bVar22 = 0 < iVar11;
    if (0 < iVar11) {
      pVVar15 = &pVVar14->varType;
      iVar13 = 1;
      do {
        if (*(MatrixOrder *)((long)(pVVar15 + -1) + 0x10) == 0) {
          if (pVVar15->m_type != TYPE_ARRAY) goto LAB_006735a7;
        }
        else if (*(MatrixOrder *)((long)(pVVar15 + -1) + 0x10) == 6) {
LAB_006735a7:
          if (bVar22) {
            return false;
          }
          break;
        }
        bVar22 = iVar13 < iVar11;
        pVVar15 = pVVar15 + 4;
        iVar1 = iVar6 * 0x55555555 + iVar13;
        iVar13 = iVar13 + 1;
      } while (iVar1 != 0);
    }
    pIVar17 = (this->m_defaultBlock).interfaceBlocks.
              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar6 = (int)((ulong)((long)(this->m_defaultBlock).interfaceBlocks.
                                super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17) >> 4);
    iVar11 = iVar6 * 0x38e38e39;
    bVar22 = 0 < iVar11;
    if (0 < iVar11) {
      ppiVar9 = (pointer *)
                ((long)&(pIVar17->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl
                + 8);
      iVar13 = 1;
      do {
        if (*(int *)((long)ppiVar9 + -0x6c) == 0) {
          if (((_Vector_impl_data *)(ppiVar9 + -1))->_M_start == *ppiVar9) goto LAB_0067370d;
        }
        else if (*(int *)((long)ppiVar9 + -0x6c) == 6) goto LAB_0067370d;
        bVar22 = iVar13 < iVar11;
        ppiVar9 = ppiVar9 + 0x12;
        iVar1 = iVar6 * -0x38e38e39 + iVar13;
        iVar13 = iVar13 + 1;
      } while (iVar1 != 0);
    }
    break;
  case SHADERTYPE_COMPUTE:
    pVVar14 = (this->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).variables.
                         super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar14 >> 5) *
             -0x55555555;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pSVar10 = &pVVar14->storage;
      uVar16 = 1;
      do {
        if ((*pSVar10 < STORAGE_LAST) && ((99U >> (*pSVar10 & 0x1f) & 1) != 0)) {
          if (bVar22) {
            return false;
          }
          break;
        }
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pSVar10 = pSVar10 + 0x18;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
    pIVar17 = (this->m_defaultBlock).interfaceBlocks.
              super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar20 = (int)((long)(this->m_defaultBlock).interfaceBlocks.
                         super__Vector_base<glu::InterfaceBlock,_std::allocator<glu::InterfaceBlock>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar17 >> 4) *
             0x38e38e39;
    bVar22 = 0 < (int)uVar20;
    if (0 < (int)uVar20) {
      pSVar10 = &pIVar17->storage;
      uVar16 = 1;
      do {
        if ((*pSVar10 < STORAGE_LAST) && ((99U >> (*pSVar10 & 0x1f) & 1) != 0)) goto LAB_0067370d;
        bVar22 = uVar16 < (uVar20 & 0x7fffffff);
        pSVar10 = pSVar10 + 0x24;
        bVar5 = uVar16 != (uVar20 & 0x7fffffff);
        uVar16 = uVar16 + 1;
      } while (bVar5);
    }
  }
  return true;
}

Assistant:

bool Shader::isValid (void) const
{
	// Default block variables
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			// atomic declaration in the default block without binding
			if (m_defaultBlock.variables[varNdx].layout.binding == -1 &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// atomic declaration in a struct
			if (m_defaultBlock.variables[varNdx].varType.isStructType() &&
				containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeAtomicCounter))
				return false;

			// Unsupported layout qualifiers

			if (m_defaultBlock.variables[varNdx].layout.matrixOrder != glu::MATRIXORDER_LAST)
				return false;

			if (containsMatchingSubtype(m_defaultBlock.variables[varNdx].varType, glu::isDataTypeSampler))
			{
				const glu::Layout layoutWithLocationAndBinding(m_defaultBlock.variables[varNdx].layout.location, m_defaultBlock.variables[varNdx].layout.binding);

				if (m_defaultBlock.variables[varNdx].layout != layoutWithLocationAndBinding)
					return false;
			}
		}
	}

	// Interface blocks
	{
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			// ES31 disallows interface block array arrays
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.size() > 1)
				return false;

			// Interface block arrays must have instance name
			if (!m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty() && m_defaultBlock.interfaceBlocks[interfaceNdx].instanceName.empty())
				return false;

			// Opaque types in interface block
			if (containsMatchingSubtype(m_defaultBlock.interfaceBlocks[interfaceNdx].variables, isOpaqueType))
				return false;
		}
	}

	// Shader type specific

	if (m_shaderType == glu::SHADERTYPE_VERTEX)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalVertexInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalVertexOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_FRAGMENT)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && isIllegalFragmentInput(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && m_defaultBlock.variables[varNdx].interpolation != glu::INTERPOLATION_FLAT && isTypeIntegerOrContainsIntegers(m_defaultBlock.variables[varNdx].varType))
				return false;
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && isIllegalFragmentOutput(m_defaultBlock.variables[varNdx].varType))
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_COMPUTE)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN			||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT		||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_GEOMETRY)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN	||
				m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
			{
				return false;
			}
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
			// arrayed output
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_OUT && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_IN)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
			// arrayed output
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_OUT && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else if (m_shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
	{
		for (int varNdx = 0; varNdx < (int)m_defaultBlock.variables.size(); ++varNdx)
		{
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.variables[varNdx].storage == glu::STORAGE_IN && !m_defaultBlock.variables[varNdx].varType.isArrayType())
				return false;
		}
		for (int interfaceNdx = 0; interfaceNdx < (int)m_defaultBlock.interfaceBlocks.size(); ++interfaceNdx)
		{
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_PATCH_OUT)
				return false;
			// arrayed input
			if (m_defaultBlock.interfaceBlocks[interfaceNdx].storage == glu::STORAGE_IN && m_defaultBlock.interfaceBlocks[interfaceNdx].dimensions.empty())
				return false;
		}
	}
	else
		DE_ASSERT(false);

	return true;
}